

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_shift_right(bitset_t *bitset,size_t s)

{
  ulong uVar1;
  uint64_t *puVar2;
  size_t sVar3;
  byte bVar4;
  size_t newarraysize;
  ulong uVar5;
  ulong uVar6;
  uint64_t *puVar7;
  
  uVar5 = s >> 6;
  uVar1 = bitset->arraysize;
  if ((s & 0x3f) == 0) {
    newarraysize = uVar1 - uVar5;
    for (sVar3 = 0; newarraysize != sVar3; sVar3 = sVar3 + 1) {
      bitset->array[sVar3] = bitset->array[sVar3 + uVar5];
    }
  }
  else {
    bVar4 = (byte)s & 0x3f;
    puVar2 = bitset->array;
    puVar7 = puVar2;
    uVar6 = uVar5;
    while (uVar6 = uVar6 + 1, uVar6 < uVar1) {
      *puVar7 = puVar7[uVar5 + 1] << (0x40 - ((byte)s & 0x3f) & 0x3f) | puVar7[uVar5] >> bVar4;
      puVar7 = puVar7 + 1;
    }
    newarraysize = uVar1 - uVar5;
    puVar2[newarraysize - 1] = puVar2[uVar1 - 1] >> bVar4;
  }
  bitset_resize(bitset,newarraysize,false);
  return;
}

Assistant:

void bitset_shift_right(bitset_t *bitset, size_t s) {
  size_t extra_words = s / 64;
  int inword_shift = s % 64;
  size_t as = bitset->arraysize;
  if(inword_shift == 0) {
    // could be done with a memmove
    for(size_t i = 0 ; i < as - extra_words; i++) {
      bitset->array[i] = bitset->array[i + extra_words];
    }
    bitset_resize(bitset,as - extra_words, false);

  } else {
    for(size_t i = 0 ; i + extra_words + 1 < as ; i++) {
      bitset->array[i] = (bitset->array[i + extra_words] >> inword_shift)
      | (bitset->array[i + extra_words + 1] << (64 - inword_shift));
    }
    bitset->array[as - extra_words - 1] = (bitset->array[as - 1] >> inword_shift);
    bitset_resize(bitset,as - extra_words , false);
  }
}